

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgHierarchyManipulator.cpp
# Opt level: O2

void __thiscall
TasGrid::HierarchyManipulations::SplitDirections::SplitDirections
          (SplitDirections *this,MultiIndexSet *points)

{
  int iVar1;
  size_t sVar2;
  pointer piVar3;
  long lVar4;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_mkstoyanov[P]TASMANIAN_SparseGrids_tsgHierarchyManipulator_cpp:335:43)>
  __comp;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_mkstoyanov[P]TASMANIAN_SparseGrids_tsgHierarchyManipulator_cpp:335:43)>
  __comp_00;
  _Val_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_mkstoyanov[P]TASMANIAN_SparseGrids_tsgHierarchyManipulator_cpp:335:43)>
  __comp_01;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_mkstoyanov[P]TASMANIAN_SparseGrids_tsgHierarchyManipulator_cpp:335:43)>
  __comp_02;
  int iVar5;
  ulong uVar6;
  pointer piVar7;
  value_type_conflict3 *__value;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __i;
  long lVar8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __last;
  allocator_type local_81;
  ulong local_80;
  MultiIndexSet *local_78;
  size_t *psStack_70;
  size_t *local_68;
  size_t num_dimensions;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_58;
  vector<int,_std::allocator<int>_> map;
  
  (this->job_pnts).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->job_pnts).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->job_directions).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->job_pnts).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->job_directions).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->job_directions).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar1 = points->cache_num_indexes;
  num_dimensions = points->num_dimensions;
  local_80 = 0;
  do {
    if (num_dimensions <= local_80) {
      return;
    }
    ::std::vector<int,_std::allocator<int>_>::vector(&map,(long)iVar1,(allocator_type *)&local_78);
    piVar3 = map.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish;
    iVar5 = 0;
    for (piVar7 = map.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start;
        piVar7 != map.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_finish; piVar7 = piVar7 + 1) {
      *piVar7 = iVar5;
      iVar5 = iVar5 + 1;
    }
    psStack_70 = &num_dimensions;
    local_68 = &local_80;
    __value = map.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start;
    local_78 = points;
    if (map.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
        != map.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish) {
      lVar8 = (long)map.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)map.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
      uVar6 = lVar8 >> 2;
      lVar4 = 0x3f;
      if (uVar6 != 0) {
        for (; uVar6 >> lVar4 == 0; lVar4 = lVar4 + -1) {
        }
      }
      local_58._M_current =
           map.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
      __comp._M_comp.num_dimensions = psStack_70;
      __comp._M_comp.points = points;
      __comp._M_comp.d = local_68;
      ::std::
      __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<TasGrid::HierarchyManipulations::SplitDirections::SplitDirections(TasGrid::MultiIndexSet_const&)::__1>>
                ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                 map.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                          map.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish,(ulong)(((uint)lVar4 ^ 0x3f) * 2) ^ 0x7e
                 ,__comp);
      if (lVar8 < 0x41) {
        __comp_02._M_comp.num_dimensions = psStack_70;
        __comp_02._M_comp.points = local_78;
        __comp_02._M_comp.d = local_68;
        ::std::
        __insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<TasGrid::HierarchyManipulations::SplitDirections::SplitDirections(TasGrid::MultiIndexSet_const&)::__1>>
                  (local_58,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                            piVar3,__comp_02);
        __value = map.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start;
      }
      else {
        __last._M_current = local_58._M_current + 0x10;
        __comp_00._M_comp.num_dimensions = psStack_70;
        __comp_00._M_comp.points = local_78;
        __comp_00._M_comp.d = local_68;
        ::std::
        __insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<TasGrid::HierarchyManipulations::SplitDirections::SplitDirections(TasGrid::MultiIndexSet_const&)::__1>>
                  (local_58,__last,__comp_00);
        for (; __value = map.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start, __last._M_current != piVar3;
            __last._M_current = __last._M_current + 1) {
          __comp_01._M_comp.num_dimensions = psStack_70;
          __comp_01._M_comp.points = local_78;
          __comp_01._M_comp.d = local_68;
          ::std::
          __unguarded_linear_insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Val_comp_iter<TasGrid::HierarchyManipulations::SplitDirections::SplitDirections(TasGrid::MultiIndexSet_const&)::__1>>
                    (__last,__comp_01);
        }
      }
    }
LAB_001beac3:
    if (__value !=
        map.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish)
    {
      iVar5 = *__value;
      sVar2 = points->num_dimensions;
      piVar3 = (points->indexes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_78 = (MultiIndexSet *)CONCAT44(local_78._4_4_,(undefined4)local_80);
      ::std::vector<int,_std::allocator<int>_>::emplace_back<int>
                (&this->job_directions,(int *)&local_78);
      ::std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&local_78,1,__value,&local_81);
      ::std::
      vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
      ::emplace_back<std::vector<int,std::allocator<int>>>
                ((vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
                  *)&this->job_pnts,(vector<int,_std::allocator<int>_> *)&local_78);
      ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&local_78);
      while (__value = __value + 1,
            __value !=
            map.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish) {
        for (uVar6 = 0; num_dimensions != uVar6; uVar6 = uVar6 + 1) {
          if ((local_80 != uVar6) &&
             (piVar3[(long)iVar5 * sVar2 + uVar6] !=
              (points->indexes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[(long)*__value * points->num_dimensions + uVar6])) {
            if (uVar6 < num_dimensions) goto LAB_001beac3;
            break;
          }
        }
        ::std::vector<int,_std::allocator<int>_>::push_back
                  ((this->job_pnts).
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish + -1,__value);
      }
      goto LAB_001beac3;
    }
    ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&map.super__Vector_base<int,_std::allocator<int>_>);
    local_80 = local_80 + 1;
  } while( true );
}

Assistant:

SplitDirections::SplitDirections(const MultiIndexSet &points){
    // split the points into "jobs", where each job represents a batch of
    // points that lay on a line in some direction
    // int    job_directions[i] gives the direction of the i-th job
    // vector job_pnts[i] gives a list of the points (using indexes within the set)
    int num_points = points.getNumIndexes();
    size_t num_dimensions = points.getNumDimensions();

    auto doesBelongSameLine = [&](const int a[], const int b[], size_t direction)->
                                    bool{
                                        for(size_t i=0; i<num_dimensions; i++)
                                            if ((i != direction) && (a[i] != b[i])) return false;
                                        return true;
                                    };

    for(size_t d=0; d<num_dimensions; d++){
        // working with direction d
        // sort all points but ignore index d
        std::vector<int> map(num_points);
        std::iota(map.begin(), map.end(), 0);
        std::sort(map.begin(), map.end(), [&](int a, int b)->bool{
            const int * idxa = points.getIndex(a);
            const int * idxb = points.getIndex(b);
            // lexigographical order ignoring dimension d
            for(size_t j=0; j<num_dimensions; j++)
                if (j != d){
                    if (idxa[j] < idxb[j]) return true;
                    if (idxa[j] > idxb[j]) return false;
                }
            return false;
        });

        auto imap = map.begin();
        while(imap != map.end()){
            // new job, get reference index
            const int *p = points.getIndex(*imap);
            job_directions.push_back((int) d);
            job_pnts.emplace_back(std::vector<int>(1, *imap++));
            // while the points are in the same direction as the reference, add to the same job
            while((imap != map.end()) && doesBelongSameLine(p, points.getIndex(*imap), d))
                job_pnts.back().push_back(*imap++);
        }
    }
}